

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AnalyzedAssertion.cpp
# Opt level: O3

void __thiscall
slang::analysis::AnalyzedAssertion::AnalyzedAssertion
          (AnalyzedAssertion *this,AnalysisContext *context,TimingControl *contextualClock,
          AnalyzedProcedure *procedure,Statement *stmt,Symbol *checkerInstance)

{
  char *pcVar1;
  AssertionExpr *this_00;
  TimingControl *left;
  Symbol *symbol;
  bool bVar2;
  AnalyzedScope *pAVar3;
  Diagnostic *this_01;
  size_t i;
  ulong uVar4;
  SourceRange sourceRange;
  VisitResult result;
  ClockVisitor visitor;
  TimingControl *local_e8;
  VisitFlags local_dc;
  VisitResult local_d8;
  ClockVisitor local_a0;
  
  this->checkerScope = (AnalyzedScope *)0x0;
  local_e8 = contextualClock;
  if (checkerInstance == (Symbol *)0x0) {
    local_a0.parentSymbol = (procedure->analyzedSymbol).ptr;
    pcVar1 = local_a0.expansionStack.
             super_SmallVectorBase<slang::analysis::ClockInference::ExpansionInstance>.firstElement;
    local_a0.expansionStack.
    super_SmallVectorBase<slang::analysis::ClockInference::ExpansionInstance>.len = 0;
    local_a0.expansionStack.
    super_SmallVectorBase<slang::analysis::ClockInference::ExpansionInstance>.cap = 2;
    local_a0.globalFutureSampledValueCall._0_7_ = 0;
    local_a0.globalFutureSampledValueCall._7_1_ = 0;
    local_a0.hasInferredClockCall = false;
    local_a0.hasMatchItems = false;
    local_a0.bad = false;
    if (((local_a0.parentSymbol)->parentScope != (Scope *)0x0) &&
       ((local_a0.parentSymbol)->parentScope->thisSym->kind == CheckerInstanceBody)) {
      local_a0.hasInferredClockCall = true;
    }
    this_00 = *(AssertionExpr **)(stmt + 1);
    local_dc = None;
    local_a0.context = context;
    local_a0.procedure = procedure;
    local_a0.expansionStack.
    super_SmallVectorBase<slang::analysis::ClockInference::ExpansionInstance>.data_ =
         (pointer)pcVar1;
    ast::AssertionExpr::
    visit<slang::analysis::ClockVisitor,slang::ast::TimingControl_const*&,slang::analysis::VisitFlags>
              (&local_d8,this_00,&local_a0,&local_e8,&local_dc);
    if ((local_a0.bad == false) &&
       (1 < local_d8.clocks.super_SmallVectorBase<const_slang::ast::TimingControl_*>.len)) {
      left = *local_d8.clocks.super_SmallVectorBase<const_slang::ast::TimingControl_*>.data_;
      uVar4 = 1;
      do {
        bVar2 = isSameClock(left,local_d8.clocks.
                                 super_SmallVectorBase<const_slang::ast::TimingControl_*>.data_
                                 [uVar4]);
        if (!bVar2) {
          symbol = (procedure->analyzedSymbol).ptr;
          sourceRange = slang::syntax::SyntaxNode::sourceRange(this_00->syntax);
          this_01 = AnalysisContext::addDiag(context,symbol,(DiagCode)0x7000e,sourceRange);
          Diagnostic::addNote(this_01,(DiagCode)0xa000e,left->sourceRange);
          Diagnostic::addNote(this_01,(DiagCode)0xa000e,
                              local_d8.clocks.
                              super_SmallVectorBase<const_slang::ast::TimingControl_*>.data_[uVar4]
                              ->sourceRange);
          break;
        }
        uVar4 = uVar4 + 1;
      } while (uVar4 < local_d8.clocks.super_SmallVectorBase<const_slang::ast::TimingControl_*>.len)
      ;
    }
    if (local_d8.clocks.super_SmallVectorBase<const_slang::ast::TimingControl_*>.data_ !=
        (pointer)local_d8.clocks.super_SmallVectorBase<const_slang::ast::TimingControl_*>.
                 firstElement) {
      operator_delete(local_d8.clocks.super_SmallVectorBase<const_slang::ast::TimingControl_*>.data_
                     );
    }
    if (local_a0.expansionStack.
        super_SmallVectorBase<slang::analysis::ClockInference::ExpansionInstance>.data_ !=
        (pointer)pcVar1) {
      operator_delete(local_a0.expansionStack.
                      super_SmallVectorBase<slang::analysis::ClockInference::ExpansionInstance>.
                      data_);
    }
  }
  else {
    pAVar3 = AnalysisManager::analyzeScopeBlocking
                       ((context->manager).ptr,(Scope *)(checkerInstance[1].name._M_str + 0x40),
                        procedure);
    this->checkerScope = pAVar3;
  }
  return;
}

Assistant:

AnalyzedAssertion::AnalyzedAssertion(AnalysisContext& context, const TimingControl* contextualClock,
                                     const AnalyzedProcedure& procedure, const Statement& stmt,
                                     const Symbol* checkerInstance) {
    if (checkerInstance) {
        checkerScope = &context.manager->analyzeScopeBlocking(
            checkerInstance->as<CheckerInstanceSymbol>().body, &procedure);
    }
    else {
        ClockVisitor visitor(context, &procedure, *procedure.analyzedSymbol);

        auto& propSpec = stmt.as<ConcurrentAssertionStatement>().propertySpec;
        auto result = propSpec.visit(visitor, contextualClock, VisitFlags::None);

        if (!visitor.bad && result.clocks.size() > 1) {
            // There must be a unique semantic leading clock.
            auto firstClock = result.clocks[0];
            for (size_t i = 1; i < result.clocks.size(); i++) {
                if (!isSameClock(*firstClock, *result.clocks[i])) {
                    SLANG_ASSERT(propSpec.syntax);
                    auto& diag = context.addDiag(*procedure.analyzedSymbol, diag::NoUniqueClock,
                                                 propSpec.syntax->sourceRange());
                    diag.addNote(diag::NoteClockHere, firstClock->sourceRange);
                    diag.addNote(diag::NoteClockHere, result.clocks[i]->sourceRange);
                    break;
                }
            }
        }
    }
}